

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hashutil.cpp
# Opt level: O2

void __thiscall
HashUtil_Sha256String_Test::HashUtil_Sha256String_Test(HashUtil_Sha256String_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_005b5d28;
  return;
}

Assistant:

TEST(HashUtil, Sha256String) {
  ByteData256 byte_data = HashUtil::Sha256("test Sha256 OK");
  EXPECT_STREQ(
      byte_data.GetHex().c_str(),
      "98478d92e5005d232ad06c805eccf5381f47f6f51ee7803e5206dc04e2639a62");

  ByteData byte_data2 = (HashUtil("Sha256") << "test Sha256 OK").Output();
  EXPECT_STREQ(
      byte_data2.GetHex().c_str(),
      "98478d92e5005d232ad06c805eccf5381f47f6f51ee7803e5206dc04e2639a62");
}